

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall kj::Exception::extendTrace(Exception *this,uint ignoreCount,uint limit)

{
  ulong uVar1;
  kj *this_00;
  uint ignoreCount_00;
  size_t elementCount;
  ulong uVar2;
  size_t sVar3;
  undefined8 *puVar4;
  void **ptrCopy;
  kj *pkVar5;
  ArrayPtr<void_*const> AVar6;
  ArrayPtr<void_*> space;
  Array<void_*> newTraceSpace_heap;
  void *newTraceSpace_stack [40];
  undefined8 *puVar7;
  kj local_178 [328];
  
  if (this->isFullTrace == false) {
    uVar1 = 0x20;
    if (limit < 0x20) {
      uVar1 = (ulong)limit;
    }
    elementCount = uVar1 + ignoreCount + 1;
    if (uVar1 + ignoreCount < 0x28) {
      puVar7 = (undefined8 *)0x0;
      this_00 = local_178;
      puVar4 = (undefined8 *)0x0;
      sVar3 = 0;
      pkVar5 = (kj *)0x0;
      ignoreCount_00 = ignoreCount;
    }
    else {
      ignoreCount_00 = 0;
      this_00 = (kj *)kj::_::HeapArrayDisposer::allocateImpl
                                (8,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                 (_func_void_void_ptr *)0x0);
      puVar4 = &kj::_::HeapArrayDisposer::instance;
      puVar7 = &kj::_::HeapArrayDisposer::instance;
      sVar3 = elementCount;
      pkVar5 = this_00;
    }
    space.size_._0_4_ = ignoreCount + 1;
    space.ptr = (void **)elementCount;
    space.size_._4_4_ = 0;
    AVar6 = getStackTrace(this_00,space,ignoreCount_00);
    uVar1 = AVar6.size_;
    if (ignoreCount + 2 < uVar1) {
      uVar2 = 0x20 - (ulong)this->traceCount;
      if (uVar1 <= uVar2) {
        uVar2 = uVar1;
      }
      memcpy(this->trace + this->traceCount,AVar6.ptr,uVar2 * 8);
      this->traceCount = this->traceCount + (int)uVar2;
      this->isFullTrace = true;
    }
    if (pkVar5 != (kj *)0x0) {
      (**(code **)*puVar4)(puVar4,pkVar5,8,sVar3,sVar3,0,0,0,puVar7);
    }
  }
  return;
}

Assistant:

void Exception::extendTrace(uint ignoreCount, uint limit) {
  if (isFullTrace) {
    // Awkward: extendTrace() was called twice without truncating in between. This should probably
    // be an error, but historically we didn't check for this so I'm hesitant to make it an error
    // now. We shouldn't actually extend the trace, though, as our current trace is presumably
    // rooted in main() and it'd be weird to append frames "above" that.
    // TODO(cleanup): Abort here and see what breaks?
    return;
  }

  KJ_STACK_ARRAY(void*, newTraceSpace, kj::min(kj::size(trace), limit) + ignoreCount + 1,
      sizeof(trace)/sizeof(trace[0]) + 8, 128);

  auto newTrace = kj::getStackTrace(newTraceSpace, ignoreCount + 1);
  if (newTrace.size() > ignoreCount + 2) {
    // Remove suffix that won't fit into our static-sized trace.
    newTrace = newTrace.first(kj::min(kj::size(trace) - traceCount, newTrace.size()));

    // Copy the rest into our trace.
    memcpy(trace + traceCount, newTrace.begin(), newTrace.asBytes().size());
    traceCount += newTrace.size();
    isFullTrace = true;
  }
}